

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

MSize var_lookup_(FuncState *fs,GCstr *name,ExpDesc *e,int first)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  FuncScope *pFVar5;
  ulong uVar6;
  MSize MVar7;
  ulong uVar8;
  
  if (fs == (FuncState *)0x0) {
    e->k = VGLOBAL;
    e->t = 0xffffffff;
    e->f = 0xffffffff;
    (e->u).sval = name;
    return 0xffffffff;
  }
  uVar3 = fs->nactvar;
  uVar4 = uVar3;
  do {
    uVar4 = uVar4 - 1;
    uVar3 = uVar3 - 1;
    if ((int)uVar3 < 0) {
      uVar3 = 0xffffffff;
      break;
    }
  } while ((GCstr *)(ulong)fs->ls->vstack[*(ushort *)((long)fs->varmap + (ulong)(uVar4 * 2))].name.
                           gcptr32 != name);
  if ((int)uVar3 < 0) {
    uVar4 = var_lookup_(fs->prev,name,e,0);
    if ((int)uVar4 < 0) {
      bVar2 = true;
      goto LAB_0011b11d;
    }
    bVar1 = fs->nuv;
    uVar6 = (ulong)bVar1;
    uVar3 = (uint)bVar1;
    if (bVar1 != 0) {
      uVar8 = 0;
      do {
        if (uVar4 == fs->uvmap[uVar8]) {
          uVar3 = (uint)uVar8;
          goto LAB_0011b10f;
        }
        uVar8 = uVar8 + 1;
      } while (uVar6 != uVar8);
    }
    if (0x3b < bVar1) {
      err_limit(fs,0x3c,"upvalues");
    }
    fs->uvmap[uVar6] = (VarIndex)uVar4;
    MVar7 = uVar4;
    if (e->k != VLOCAL) {
      MVar7 = (e->u).s.info + 0xffc4;
    }
    fs->uvtmp[uVar6] = (VarIndex)MVar7;
    fs->nuv = bVar1 + 1;
LAB_0011b10f:
    (e->u).s.info = uVar3 & 0xff;
    e->k = VUPVAL;
  }
  else {
    e->k = VLOCAL;
    e->t = 0xffffffff;
    (e->u).s.info = uVar3;
    e->f = 0xffffffff;
    if (first == 0) {
      pFVar5 = (FuncScope *)&fs->bl;
      do {
        pFVar5 = pFVar5->prev;
        if (pFVar5 == (FuncScope *)0x0) goto LAB_0011b09b;
      } while (uVar3 < pFVar5->nactvar);
      pFVar5->flags = pFVar5->flags | 8;
    }
LAB_0011b09b:
    uVar4 = (uint)fs->varmap[uVar3];
    *(uint *)((long)&e->u + 4) = (uint)fs->varmap[uVar3];
  }
  bVar2 = false;
LAB_0011b11d:
  if (bVar2) {
    return 0xffffffff;
  }
  return uVar4;
}

Assistant:

static MSize var_lookup_(FuncState *fs, GCstr *name, ExpDesc *e, int first)
{
  if (fs) {
    BCReg reg = var_lookup_local(fs, name);
    if ((int32_t)reg >= 0) {  /* Local in this function? */
      expr_init(e, VLOCAL, reg);
      if (!first)
	fscope_uvmark(fs, reg);  /* Scope now has an upvalue. */
      return (MSize)(e->u.s.aux = (uint32_t)fs->varmap[reg]);
    } else {
      MSize vidx = var_lookup_(fs->prev, name, e, 0);  /* Var in outer func? */
      if ((int32_t)vidx >= 0) {  /* Yes, make it an upvalue here. */
	e->u.s.info = (uint8_t)var_lookup_uv(fs, vidx, e);
	e->k = VUPVAL;
	return vidx;
      }
    }
  } else {  /* Not found in any function, must be a global. */
    expr_init(e, VGLOBAL, 0);
    e->u.sval = name;
  }
  return (MSize)-1;  /* Global. */
}